

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  long *plVar8;
  const_iterator cVar9;
  ulong uVar10;
  ulong *puVar11;
  size_type *psVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer ppVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  _Base_ptr p_Var18;
  _Alloc_hider _Var19;
  bool bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  String *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Base_ptr local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  pointer local_f8;
  undefined2 *local_f0;
  _Base_ptr local_e8;
  undefined2 local_e0;
  undefined1 local_de;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  _Base_ptr local_b0;
  Options *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Base_ptr local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_38;
  
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_a8 = this;
  if ((_Rb_tree_header *)cVar7._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar14 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar14;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_170 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_118," ",g);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
      paVar1 = &local_190.field_2;
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_190.field_2._M_allocated_capacity = *puVar11;
        local_190.field_2._8_8_ = plVar8[3];
        local_190._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar11;
        local_190._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_160.first._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      paVar2 = &local_160.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == paVar1) {
        local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
        local_190._M_dataplus._M_p = (pointer)paVar2;
      }
      local_160.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_160.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    }
    ppVar15 = *(pointer *)(cVar7._M_node + 4);
    local_f8 = (pointer)cVar7._M_node[4]._M_parent;
    local_168 = paVar14;
    if (ppVar15 != local_f8) {
      local_a8 = (Options *)&local_a8->m_positional_set;
      paVar14 = &local_160.second.field_2;
      local_120 = (_Base_ptr)0x0;
      local_b0 = cVar7._M_node;
      do {
        if ((ppVar15[3].first.field_2._M_local_buf[0] != '\x01') ||
           (cVar9 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_a8,&ppVar15->second),
           cVar9.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur == (__node_type *)0x0)) {
          local_f0 = &local_e0;
          local_e0 = 0x2020;
          local_e8 = (_Base_ptr)0x2;
          local_de = 0;
          if ((_Base_ptr)(ppVar15->first)._M_string_length == (_Base_ptr)0x0) {
            std::__cxx11::string::append((char *)&local_f0);
          }
          else {
            std::operator+(&local_190,"-",&ppVar15->first);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            puVar11 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_160.first.field_2._M_allocated_capacity = *puVar11;
              local_160.first.field_2._8_8_ = plVar8[3];
            }
            else {
              local_160.first.field_2._M_allocated_capacity = *puVar11;
              local_160.first._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_160.first._M_string_length = plVar8[1];
            *plVar8 = (long)puVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_f0,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
          }
          if ((ppVar15->second)._M_string_length != 0) {
            std::operator+(&local_160.first," --",&ppVar15->second);
            std::__cxx11::string::_M_append
                      ((char *)&local_f0,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
          }
          if (*(char *)&ppVar15[1].second._M_dataplus._M_p == '\x01') {
            lVar3 = *(long *)((long)&ppVar15[2].second.field_2 + 8);
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            if (lVar3 == 0) {
              local_160.first._M_string_length = 3;
              local_160.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
            }
            else {
              sVar4 = ppVar15[2].second.field_2._M_allocated_capacity;
              std::__cxx11::string::_M_construct<char*>((string *)&local_160,sVar4,sVar4 + lVar3);
            }
            if (*(char *)&ppVar15[2].first._M_string_length == '\x01') {
              std::operator+(&local_78," [=",&local_160.first);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              psVar12 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_a0.field_2._M_allocated_capacity = *psVar12;
                local_a0.field_2._8_8_ = plVar8[3];
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar12;
                local_a0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_a0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a0,
                                          (ulong)ppVar15[2].first.field_2._M_allocated_capacity);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              puVar11 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_118.field_2._M_allocated_capacity = *puVar11;
                local_118.field_2._8_8_ = plVar8[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar11;
                local_118._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_118._M_string_length = plVar8[1];
              *plVar8 = (long)puVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              puVar11 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_190.field_2._M_allocated_capacity = *puVar11;
                local_190.field_2._8_8_ = plVar8[3];
              }
              else {
                local_190.field_2._M_allocated_capacity = *puVar11;
                local_190._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_190._M_string_length = plVar8[1];
              *plVar8 = (long)puVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_190._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              pbVar6 = &local_78;
              _Var13._M_p = local_78._M_dataplus._M_p;
            }
            else {
              std::operator+(&local_190," ",&local_160.first);
              std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_190._M_dataplus._M_p);
              pbVar6 = &local_190;
              _Var13._M_p = local_190._M_dataplus._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var13._M_p != &pbVar6->field_2) {
              operator_delete(_Var13._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
          }
          if (local_120 <= local_e8) {
            local_120 = local_e8;
          }
          paVar1 = &local_190.field_2;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_f0,
                     (byte *)((long)&local_e8->_M_color + (long)local_f0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar1) {
            local_160.second.field_2._8_8_ = local_190.field_2._8_8_;
            local_160.second._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_160.second._M_dataplus._M_p = local_190._M_dataplus._M_p;
          }
          local_160.second.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
          local_160.second._M_string_length = local_190._M_string_length;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_58,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.second._M_dataplus._M_p != paVar14) {
            operator_delete(local_160.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
            operator_delete(local_160.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
        }
        ppVar15 = (pointer)(ppVar15[3].first.field_2._M_local_buf + 8);
      } while (ppVar15 != local_f8);
      p_Var18 = *(_Base_ptr *)(local_b0 + 4);
      local_b0 = local_b0[4]._M_parent;
      local_80 = (_Base_ptr)0x1e;
      if (local_120 < (_Base_ptr)0x1e) {
        local_80 = local_120;
      }
      __return_storage_ptr__ = local_170;
      if (p_Var18 != local_b0) {
        uVar16 = 0x4a - (long)local_80;
        local_120 = (_Base_ptr)((long)&local_80->_M_color + 2);
        ppVar15 = local_58.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((*(char *)&p_Var18[6]._M_left != '\x01') ||
             (cVar9 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)local_a8,(key_type *)(p_Var18 + 1)),
             cVar9.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,*(long *)(p_Var18 + 2),
                       (long)&(p_Var18[2]._M_parent)->_M_color + *(long *)(p_Var18 + 2));
            if (*(byte *)((long)&p_Var18[3]._M_color + 1) == 1) {
              std::operator+(&local_a0," (default: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var18[3]._M_parent);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
              paVar14 = &local_118.field_2;
              puVar11 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_118.field_2._M_allocated_capacity = *puVar11;
                local_118.field_2._8_8_ = plVar8[3];
                local_118._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar11;
                local_118._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_190._M_string_length = plVar8[1];
              *plVar8 = (long)puVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p == paVar14) {
                local_190.field_2._8_8_ = local_118.field_2._8_8_;
                local_118._M_dataplus._M_p = (pointer)&local_190.field_2;
              }
              local_190.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
              local_118._M_string_length = 0;
              local_118.field_2._M_allocated_capacity =
                   local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_190._M_dataplus._M_p = local_118._M_dataplus._M_p;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_118._M_dataplus._M_p;
              local_118._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_append((char *)&local_160,(ulong)paVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
            }
            local_d0 = local_c0;
            local_c8 = 0;
            local_c0[0] = 0;
            _Var13._M_p = local_160.first._M_dataplus._M_p;
            local_f8 = ppVar15;
            if (local_160.first._M_string_length != 0) {
              uVar10 = 0;
              _Var17._M_p = local_160.first._M_dataplus._M_p;
              _Var19._M_p = local_160.first._M_dataplus._M_p;
              local_38 = p_Var18;
              do {
                if (*_Var19._M_p == ' ') {
                  _Var17._M_p = _Var19._M_p;
                }
                if (uVar16 < uVar10) {
                  if (_Var17._M_p == _Var13._M_p) {
                    std::__cxx11::string::replace
                              ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var13._M_p);
                    paVar14 = &local_78.field_2;
                    local_78.field_2._M_allocated_capacity._0_2_ = 10;
                    local_78._M_string_length = 1;
                    local_78._M_dataplus._M_p = (pointer)paVar14;
                    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)paVar14);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != paVar14) {
                      operator_delete(local_78._M_dataplus._M_p);
                    }
                    std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_d0,local_c8,0,(char)local_120);
                    _Var13._M_p = _Var19._M_p + 1;
                    _Var17._M_p = _Var13._M_p;
                  }
                  else {
                    std::__cxx11::string::replace
                              ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var13._M_p);
                    local_e0 = 10;
                    local_e8 = (_Base_ptr)0x1;
                    local_f0 = &local_e0;
                    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)&local_e0);
                    if (local_f0 != &local_e0) {
                      operator_delete(local_f0);
                    }
                    std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_d0,local_c8,0,(char)local_120);
                    _Var13._M_p = _Var17._M_p + 1;
                  }
                  uVar10 = 0;
                }
                else {
                  uVar10 = uVar10 + 1;
                }
                _Var19._M_p = _Var19._M_p + 1;
                p_Var18 = local_38;
              } while (_Var19._M_p !=
                       local_160.first._M_dataplus._M_p + local_160.first._M_string_length);
            }
            __return_storage_ptr__ = local_170;
            paVar14 = &local_160.first.field_2;
            std::__cxx11::string::replace((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var13._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != paVar14) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
            ppVar15 = local_f8;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)(local_f8->first)._M_dataplus._M_p);
            p_Var5 = (_Base_ptr)(ppVar15->first)._M_string_length;
            if (local_80 < p_Var5) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              paVar14 = &local_190.field_2;
              local_190._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p == paVar14) {
                local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
                local_190._M_dataplus._M_p = (pointer)&local_160.first.field_2;
              }
              local_160.first.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity;
              local_160.first._M_string_length = local_190._M_string_length;
              local_190._M_string_length = 0;
              local_190.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
              local_190._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
              bVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_160.first._M_dataplus._M_p == &local_160.first.field_2;
            }
            else {
              paVar1 = &local_190.field_2;
              local_190._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_120 - (char)p_Var5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p == paVar1) {
                local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
                local_190._M_dataplus._M_p = (pointer)paVar14;
              }
              local_160.first.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity;
              local_160.first._M_string_length = local_190._M_string_length;
              local_190._M_string_length = 0;
              local_190.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
              local_190._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
              bVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_160.first._M_dataplus._M_p == paVar14;
            }
            if (!bVar20) {
              operator_delete(local_160.first._M_dataplus._M_p);
            }
            ppVar15 = local_f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            if (local_d0 != local_c0) {
              operator_delete(local_d0);
            }
            ppVar15 = ppVar15 + 1;
          }
          p_Var18 = (_Base_ptr)&p_Var18[6]._M_right;
        } while (p_Var18 != local_b0);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}